

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

int luaO_int2fb(uint x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  if (7 < x) {
    iVar3 = 0;
    if (0x7f < x) {
      iVar3 = 0;
      do {
        uVar2 = x + 0xf;
        x = uVar2 >> 4;
        iVar3 = iVar3 + 4;
      } while (0x7ff < uVar2);
    }
    uVar2 = x;
    if (0xf < x) {
      do {
        x = uVar2 + 1 >> 1;
        iVar3 = iVar3 + 1;
        bVar1 = 0x1e < uVar2;
        uVar2 = x;
      } while (bVar1);
    }
    x = x - 8 | iVar3 * 8 + 8U;
  }
  return x;
}

Assistant:

int luaO_int2fb(unsigned int x) {
    int e = 0;  /* exponent */
    if (x < 8) return x;
    while (x >= (8 << 4)) {  /* coarse steps */
        x = (x + 0xf) >> 4;  /* x = ceil(x / 16) */
        e += 4;
    }
    while (x >= (8 << 1)) {  /* fine steps */
        x = (x + 1) >> 1;  /* x = ceil(x / 2) */
        e++;
    }
    return ((e + 1) << 3) | (cast_int(x) - 8);
}